

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O0

BoolInt CPU_IsSupported_SHA(void)

{
  UInt32 UVar1;
  UInt32 local_28;
  uint local_24;
  UInt32 d [4];
  uint local_c;
  
  UVar1 = z7_x86_cpuid_GetMaxFunc();
  if (UVar1 < 7) {
    local_c = 0;
  }
  else {
    z7_x86_cpuid(&local_28,7);
    local_c = local_24 >> 0x1d & 1;
  }
  return local_c;
}

Assistant:

BoolInt CPU_IsSupported_SHA(void)
{
  CHECK_SYS_SSE_SUPPORT

  if (z7_x86_cpuid_GetMaxFunc() < 7)
    return False;
  {
    UInt32 d[4];
    z7_x86_cpuid(d, 7);
    return (BoolInt)(d[1] >> 29) & 1;
  }
}